

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

void __thiscall
defyx::SuperscalarInstruction::toInstr(SuperscalarInstruction *this,Instruction *instr)

{
  SuperscalarInstructionType SVar1;
  Instruction *in_RSI;
  long in_RDI;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  SVar1 = getType((SuperscalarInstruction *)0x14df0d);
  in_RSI->opcode = (uint8_t)SVar1;
  in_RSI->dst = (uint8_t)*(undefined4 *)(in_RDI + 0xc);
  if (*(int *)(in_RDI + 8) < 0) {
    uVar2 = *(undefined4 *)(in_RDI + 0xc);
  }
  else {
    uVar2 = *(undefined4 *)(in_RDI + 8);
  }
  in_RSI->src = (uint8_t)uVar2;
  Instruction::setMod(in_RSI,(uint8_t)*(undefined4 *)(in_RDI + 0x10));
  Instruction::setImm32
            ((Instruction *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void toInstr(Instruction& instr) { //translate to a DefyX instruction format
			instr.opcode = (int)getType();
			instr.dst = dst_;
			instr.src = src_ >= 0 ? src_ : dst_;
			instr.setMod(mod_);
			instr.setImm32(imm32_);
		}